

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O1

int CreateBotDist(DdNode *node,st__table *pathTable,uint *pathLengthArray,FILE *fp)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int *key;
  uint uVar7;
  size_t __size;
  char *__ptr;
  NodeDist_t *nodeStat;
  NodeDist_t *nodeStatChild;
  int *local_50;
  uint local_44;
  char *local_40;
  ulong local_38;
  
  key = (int *)((ulong)node & 0xfffffffffffffffe);
  iVar2 = 1;
  if (*key != 0x7fffffff) {
    iVar2 = st__lookup(pathTable,(char *)key,(char **)&local_50);
    if (iVar2 == 0) {
      __ptr = "Something wrong, the entry doesn\'t exist\n";
      __size = 0x29;
LAB_0079375d:
      fwrite(__ptr,__size,1,(FILE *)fp);
LAB_0079376c:
      iVar2 = 0;
    }
    else {
      local_44 = 0xffffffff;
      uVar5 = 0xffffffff;
      if ((*local_50 != -1) && (uVar5 = *local_50 + local_50[2], local_50[2] == -1)) {
        uVar5 = 0xffffffff;
      }
      if ((local_50[1] != -1) && (local_44 = local_50[1] + local_50[3], local_50[3] == -1)) {
        local_44 = 0xffffffff;
      }
      if (uVar5 < local_44) {
        local_44 = uVar5;
      }
      uVar4 = *(ulong *)(key + 4);
      uVar1 = *(ulong *)(key + 6);
      local_38 = (ulong)((uint)node & 1);
      for (iVar2 = 0; (uVar6 = uVar4, iVar2 == 0 || (uVar6 = uVar1, iVar2 != 2)); iVar2 = iVar2 + 1)
      {
        if (*(int *)(uVar6 & 0xfffffffffffffffe) == 0x7fffffff) {
          if ((uVar6 & 1) == 0) {
            local_50[3] = 1;
          }
          else {
            local_50[2] = 1;
          }
        }
        else {
          iVar3 = st__lookup(pathTable,(char *)(uVar6 & 0xfffffffffffffffe),&local_40);
          if (iVar3 == 0) {
            __ptr = "Something wrong, node in table should have been created in top dist proc.\n";
            __size = 0x4a;
            goto LAB_0079375d;
          }
          if (*(int *)(local_40 + 8) == -1) {
            if (*(int *)(local_40 + 0xc) != -1) {
              __ptr = "Something wrong, both bot nodeStats should be there\n";
              __size = 0x34;
              goto LAB_0079375d;
            }
            iVar3 = CreateBotDist((DdNode *)(local_38 ^ uVar6),pathTable,pathLengthArray,fp);
            if (iVar3 == 0) goto LAB_0079376c;
          }
          uVar5 = 0xffffffff;
          if ((uVar6 & 1) == 0) {
            uVar7 = *(int *)(local_40 + 0xc) + 1U;
            if (*(int *)(local_40 + 0xc) + 1U == 0) {
              uVar7 = uVar5;
            }
            if (uVar7 < (uint)local_50[3]) {
              local_50[3] = uVar7;
            }
            iVar3 = *(int *)(local_40 + 8);
          }
          else {
            uVar7 = *(int *)(local_40 + 8) + 1U;
            if (*(int *)(local_40 + 8) + 1U == 0) {
              uVar7 = uVar5;
            }
            if (uVar7 < (uint)local_50[3]) {
              local_50[3] = uVar7;
            }
            iVar3 = *(int *)(local_40 + 0xc);
          }
          uVar7 = iVar3 + 1U;
          if (iVar3 + 1U == 0) {
            uVar7 = uVar5;
          }
          if (uVar7 < (uint)local_50[2]) {
            local_50[2] = uVar7;
          }
        }
      }
      uVar5 = 0xffffffff;
      uVar4 = 0xffffffff;
      if (*local_50 != -1) {
        uVar7 = *local_50 + local_50[2];
        if (local_50[2] == -1) {
          uVar7 = 0xffffffff;
        }
        uVar4 = (ulong)uVar7;
      }
      uVar7 = (uint)uVar4;
      iVar2 = 1;
      if ((local_50[1] != -1) && (uVar5 = local_50[1] + local_50[3], local_50[3] == -1)) {
        uVar5 = 0xffffffff;
      }
      if (uVar7 < local_44) {
        if (local_44 != 0xffffffff) {
          pathLengthArray[local_44] = pathLengthArray[local_44] - 1;
        }
        local_44 = uVar7;
        if (uVar7 != 0xffffffff) {
          pathLengthArray[uVar4] = pathLengthArray[uVar4] + 1;
        }
      }
      if (uVar5 < local_44) {
        if (local_44 != 0xffffffff) {
          pathLengthArray[local_44] = pathLengthArray[local_44] - 1;
        }
        if (uVar5 != 0xffffffff) {
          pathLengthArray[uVar5] = pathLengthArray[uVar5] + 1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static NodeStat *
CreateBotDist(
  DdNode * node,
  st__table * distanceTable)
{
    DdNode *N, *Nv, *Nnv;
    int distance, distanceNv, distanceNnv;
    NodeStat *nodeStat, *nodeStatNv, *nodeStatNnv;

#if 0
    if (Cudd_IsConstant(node)) {
        return(0);
    }
#endif
    
    /* Return the entry in the table if found. */
    N = Cudd_Regular(node);
    if ( st__lookup(distanceTable, (const char *)N, (char **)&nodeStat)) {
        nodeStat->localRef++;
        return(nodeStat);
    }

    Nv = cuddT(N);
    Nnv = cuddE(N);
    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* Recur on the children. */
    nodeStatNv = CreateBotDist(Nv, distanceTable);
    if (nodeStatNv == NULL) return(NULL);
    distanceNv = nodeStatNv->distance;

    nodeStatNnv = CreateBotDist(Nnv, distanceTable);
    if (nodeStatNnv == NULL) return(NULL);
    distanceNnv = nodeStatNnv->distance;
    /* Store max distance from constant; note sometimes this distance
    ** may be to 0.
    */
    distance = (distanceNv > distanceNnv) ? (distanceNv+1) : (distanceNnv + 1);

    nodeStat = ABC_ALLOC(NodeStat, 1);
    if (nodeStat == NULL) {
        return(0);
    }
    nodeStat->distance = distance;
    nodeStat->localRef = 1;
    
    if ( st__insert(distanceTable, (char *)N, (char *)nodeStat) ==
        st__OUT_OF_MEM) {
        return(0);

    }
    return(nodeStat);

}